

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::repaint(QWidget *this,int x,int y,int w,int h)

{
  QWidgetData *pQVar1;
  int iVar2;
  int iVar3;
  QRect r;
  
  pQVar1 = this->data;
  iVar2 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  if ((x <= iVar2) && (iVar3 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1, y <= iVar3)) {
    iVar2 = iVar2 - x;
    if (-1 < w) {
      iVar2 = w;
    }
    iVar3 = iVar3 - y;
    if (-1 < h) {
      iVar3 = h;
    }
    r.y1.m_i = y;
    r.x1.m_i = x;
    r.y2.m_i = y + iVar3 + -1;
    r.x2.m_i = x + iVar2 + -1;
    QWidgetPrivate::repaint<QRect>(*(QWidgetPrivate **)&this->field_0x8,r);
    return;
  }
  return;
}

Assistant:

void QWidget::repaint(int x, int y, int w, int h)
{
    if (x > data->crect.width() || y > data->crect.height())
        return;

    if (w < 0)
        w = data->crect.width()  - x;
    if (h < 0)
        h = data->crect.height() - y;

    repaint(QRect(x, y, w, h));
}